

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_dpb.c
# Opt level: O0

void h265e_dpb_dec_refresh_marking(H265eDpb *dpb,RK_S32 poc_cur,NALUnitType nalUnitType)

{
  ulong uVar1;
  H265eDpbFrm *frame_1;
  H265eDpbFrm *frame_list;
  H265eDpbFrm *frame;
  H265eDpbFrm *frame_List;
  RK_U32 index;
  NALUnitType nalUnitType_local;
  RK_S32 poc_cur_local;
  H265eDpb *dpb_local;
  
  if ((h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_dpb","enter\n","h265e_dpb_dec_refresh_marking");
  }
  if ((((nalUnitType == NAL_BLA_W_LP) || (nalUnitType == NAL_BLA_W_RADL)) ||
      (nalUnitType == NAL_BLA_N_LP)) ||
     ((nalUnitType == NAL_IDR_W_RADL || (nalUnitType == NAL_IDR_N_LP)))) {
    for (frame_List._4_4_ = 0; frame_List._4_4_ < 0x11; frame_List._4_4_ = frame_List._4_4_ + 1) {
      uVar1 = (ulong)frame_List._4_4_;
      if ((dpb->frame_list[uVar1].inited != 0) && (dpb->frame_list[uVar1].poc != poc_cur)) {
        (dpb->frame_list[uVar1].slice)->is_referenced = 0;
        dpb->frame_list[uVar1].is_long_term = 0;
        if (dpb->frame_list[uVar1].poc < poc_cur) {
          dpb->frame_list[uVar1].used_by_cur = 0;
          *(ushort *)&dpb->frame_list[uVar1].field_7 =
               *(ushort *)&dpb->frame_list[uVar1].field_7 & 0xff00;
          dpb->frame_list[uVar1].status.val = 0;
        }
      }
    }
    if (((nalUnitType == NAL_BLA_W_LP) || (nalUnitType == NAL_BLA_W_RADL)) ||
       (nalUnitType == NAL_BLA_N_LP)) {
      dpb->poc_cra = poc_cur;
    }
  }
  else {
    if ((dpb->refresh_pending == 1) && (dpb->poc_cra < poc_cur)) {
      for (frame_List._4_4_ = 0; frame_List._4_4_ < 0x11; frame_List._4_4_ = frame_List._4_4_ + 1) {
        uVar1 = (ulong)frame_List._4_4_;
        if (((dpb->frame_list[uVar1].inited != 0) && (dpb->frame_list[uVar1].poc != poc_cur)) &&
           (dpb->frame_list[uVar1].poc != dpb->poc_cra)) {
          (dpb->frame_list[uVar1].slice)->is_referenced = 0;
          *(ushort *)&dpb->frame_list[uVar1].field_7 =
               *(ushort *)&dpb->frame_list[uVar1].field_7 & 0xff00;
        }
      }
      dpb->refresh_pending = 0;
    }
    if (nalUnitType == NAL_CRA_NUT) {
      dpb->refresh_pending = 1;
      dpb->poc_cra = poc_cur;
    }
  }
  if ((h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_dpb","leave\n","h265e_dpb_dec_refresh_marking");
  }
  return;
}

Assistant:

void h265e_dpb_dec_refresh_marking(H265eDpb *dpb, RK_S32 poc_cur, enum NALUnitType nalUnitType)
{
    RK_U32 index = 0;

    h265e_dbg_func("enter\n");

    if (nalUnitType == NAL_BLA_W_LP
        || nalUnitType == NAL_BLA_W_RADL
        || nalUnitType == NAL_BLA_N_LP
        || nalUnitType == NAL_IDR_W_RADL
        || nalUnitType == NAL_IDR_N_LP) { // IDR or BLA picture
        // mark all pictures as not used for reference
        H265eDpbFrm *frame_List = &dpb->frame_list[0];
        for (index = 0; index < MPP_ARRAY_ELEMS(dpb->frame_list); index++) {
            H265eDpbFrm *frame = &frame_List[index];
            if (frame->inited && (frame->poc != poc_cur)) {
                frame->slice->is_referenced = 0;
                frame->is_long_term = 0;
                if (frame->poc < poc_cur) {
                    frame->used_by_cur = 0;
                    frame->dpb_used = 0;
                    frame->status.val = 0;
                }
            }
        }

        if (nalUnitType == NAL_BLA_W_LP
            || nalUnitType == NAL_BLA_W_RADL
            || nalUnitType == NAL_BLA_N_LP) {
            dpb->poc_cra = poc_cur;
        }
    } else { // CRA or No DR
        if (dpb->refresh_pending == 1 && poc_cur > dpb->poc_cra) { // CRA reference marking pending
            H265eDpbFrm *frame_list = &dpb->frame_list[0];
            for (index = 0; index < MPP_ARRAY_ELEMS(dpb->frame_list); index++) {

                H265eDpbFrm *frame = &frame_list[index];
                if (frame->inited && frame->poc != poc_cur && frame->poc != dpb->poc_cra) {
                    frame->slice->is_referenced = 0;
                    frame->dpb_used = 0;
                }
            }

            dpb->refresh_pending = 0;
        }
        if (nalUnitType == NAL_CRA_NUT) { // CRA picture found
            dpb->refresh_pending = 1;
            dpb->poc_cra = poc_cur;
        }
    }
    h265e_dbg_func("leave\n");
}